

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_pushboolean(lua_State *L,int b)

{
  StkId pTVar1;
  
  pTVar1 = L->top;
  *(uint *)&pTVar1->value_ = (uint)(b != 0);
  pTVar1->tt_ = 1;
  L->top = L->top + 1;
  return;
}

Assistant:

LUA_API void lua_pushboolean (lua_State *L, int b) {
  lua_lock(L);
  if (b)
    setbtvalue(s2v(L->top));
  else
    setbfvalue(s2v(L->top));
  api_incr_top(L);
  lua_unlock(L);
}